

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O1

uint LiteScript::AddCallback
               (_func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
                *value)

{
  _func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
  *in_RDI;
  _func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
  *local_10;
  
  if (Callback::List.
      super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      Callback::List.
      super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<LiteScript::Variable(*)(LiteScript::State&,std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>&),std::allocator<LiteScript::Variable(*)(LiteScript::State&,std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>&)>>
    ::
    _M_realloc_insert<LiteScript::Variable(*const&)(LiteScript::State&,std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>&)>
              ((vector<LiteScript::Variable(*)(LiteScript::State&,std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>&),std::allocator<LiteScript::Variable(*)(LiteScript::State&,std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>&)>>
                *)&Callback::List,
               (iterator)
               Callback::List.
               super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_10);
  }
  else {
    *Callback::List.
     super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
     ._M_impl.super__Vector_impl_data._M_finish = in_RDI;
    Callback::List.
    super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         Callback::List.
         super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  return (int)((ulong)((long)Callback::List.
                             super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)Callback::List.
                            super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1;
}

Assistant:

unsigned int LiteScript::AddCallback(Variable (*value)(State &, std::vector<Variable> &)) {
    Callback::List.push_back(value);
    return Callback::List.size() - 1;
}